

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::ValueInfo::~ValueInfo(ValueInfo *this)

{
  ValueInfo *this_local;
  
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__ValueInfo_001b35a0;
  std::__cxx11::string::~string((string *)&this->unit);
  std::__cxx11::string::~string((string *)&this->description);
  std::__cxx11::string::~string((string *)&this->name);
  Item::~Item(&this->super_Item);
  return;
}

Assistant:

~ValueInfo		(void) {}